

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
 __thiscall
booster::locale::impl_icu::generate_formatter<char>
          (impl_icu *this,ios_base *ios,Locale *locale,string *encoding)

{
  pointer pcVar1;
  long *plVar2;
  ulong uVar3;
  string *psVar4;
  ios_info *this_00;
  uint64_t uVar5;
  icu_formatters_cache *this_01;
  SimpleDateFormat *pSVar6;
  unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
  uVar7;
  number_format<char> *pnVar8;
  NumberFormat *pNVar9;
  uint64_t uVar10;
  TimeZone *pTVar11;
  date_format<char> *pdVar12;
  string_set *this_02;
  EStyle EVar13;
  uint uVar14;
  undefined4 uVar15;
  icu_std_converter<char,_1> *ftime;
  _Alloc_hider _Var16;
  EStyle EVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  UErrorCode err;
  UnicodeString pattern;
  icu_std_converter<char,_1> cvt_;
  icu_std_converter<char,_1> cvt__1;
  UErrorCode local_274;
  _Head_base<0UL,_icu_70::DateFormat_*,_false> local_270;
  string *local_268;
  undefined1 local_260 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_1f0;
  string local_1d0;
  string local_1b0 [3];
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  icu_std_converter<char,_1> local_b0;
  icu_std_converter<char,_1> local_70;
  
  *(undefined8 *)this = 0;
  this_00 = ios_info::get(ios);
  uVar5 = ios_info::display_flags(this_00);
  std::locale::locale((locale *)local_260,(locale *)(ios + 0xd0));
  this_01 = std::use_facet<booster::locale::impl_icu::icu_formatters_cache>((locale *)local_260);
  std::locale::~locale((locale *)local_260);
  if (uVar5 == 0) {
    return (__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
            )(__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
              )this;
  }
  local_274 = U_ZERO_ERROR;
  switch(uVar5) {
  case 1:
    uVar14 = *(uint *)(ios + 0x18) & 0x104;
    pNVar9 = icu_formatters_cache::number_format(this_01,(uint)(uVar14 == 0x100));
    (**(code **)(*(long *)pNVar9 + 0xe8))(pNVar9,*(undefined4 *)(ios + 8));
    if ((uVar14 == 0x100) || (uVar15 = 0, uVar14 == 4)) {
      uVar15 = *(undefined4 *)(ios + 8);
    }
    (**(code **)(*(long *)pNVar9 + 0xf0))(pNVar9,uVar15);
    pnVar8 = (number_format<char> *)operator_new(0x40);
    paVar18 = &local_d0.field_2;
    pcVar1 = (encoding->_M_dataplus)._M_p;
    local_d0._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,pcVar1 + encoding->_M_string_length);
    number_format<char>::number_format(pnVar8,pNVar9,&local_d0);
    *(number_format<char> **)this = pnVar8;
    _Var16._M_p = local_d0._M_dataplus._M_p;
    break;
  case 2:
    uVar5 = ios_info::currency_flags(this_00);
    pNVar9 = icu_formatters_cache::number_format
                       (this_01,fmt_curr_iso - ((uVar5 & 0xffffffffffffffbf) == 0));
    pnVar8 = (number_format<char> *)operator_new(0x40);
    paVar18 = &local_f0.field_2;
    pcVar1 = (encoding->_M_dataplus)._M_p;
    local_f0._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar1,pcVar1 + encoding->_M_string_length);
    number_format<char>::number_format(pnVar8,pNVar9,&local_f0);
    *(number_format<char> **)this = pnVar8;
    _Var16._M_p = local_f0._M_dataplus._M_p;
    break;
  case 3:
    pNVar9 = icu_formatters_cache::number_format(this_01,fmt_per);
    (**(code **)(*(long *)pNVar9 + 0xe8))(pNVar9,*(undefined4 *)(ios + 8));
    if (((*(uint *)(ios + 0x18) & 0x104) == 0x100) ||
       (uVar15 = 0, (*(uint *)(ios + 0x18) & 0x104) == 4)) {
      uVar15 = *(undefined4 *)(ios + 8);
    }
    (**(code **)(*(long *)pNVar9 + 0xf0))(pNVar9,uVar15);
    pnVar8 = (number_format<char> *)operator_new(0x40);
    paVar18 = &local_110.field_2;
    pcVar1 = (encoding->_M_dataplus)._M_p;
    local_110._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar1,pcVar1 + encoding->_M_string_length);
    number_format<char>::number_format(pnVar8,pNVar9,&local_110);
    *(number_format<char> **)this = pnVar8;
    _Var16._M_p = local_110._M_dataplus._M_p;
    break;
  case 4:
  case 5:
  case 6:
  case 7:
    pSVar6 = icu_formatters_cache::date_formatter(this_01);
    local_268 = encoding;
    if (pSVar6 != (SimpleDateFormat *)0x0) {
      ios_info::time_flags(this_00);
      ios_info::date_flags(this_00);
      local_260._0_8_ = std::__cxx11::moneypunct_byname<wchar_t,false>::moneypunct_byname;
      local_260._8_2_ = 2;
      uVar7._M_t.
      super___uniq_ptr_impl<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_booster::locale::impl_icu::formatter<char>_*,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
      .super__Head_base<0UL,_booster::locale::impl_icu::formatter<char>_*,_false>._M_head_impl =
           (__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
            )(*(code *)(&DAT_001ad5c8 + *(int *)(&DAT_001ad5c8 + (uVar5 - 4) * 4)))();
      return (unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
              )uVar7._M_t.
               super___uniq_ptr_impl<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_booster::locale::impl_icu::formatter<char>_*,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
               .super__Head_base<0UL,_booster::locale::impl_icu::formatter<char>_*,_false>.
               _M_head_impl;
    }
    uVar10 = ios_info::time_flags(this_00);
    uVar3 = uVar10 - 0x80 >> 7;
    EVar13 = SHORT - (int)uVar3;
    if (3 < (uVar10 << 0x39 | uVar3)) {
      EVar13 = DEFAULT;
    }
    uVar10 = ios_info::date_flags(this_00);
    uVar3 = uVar10 - 0x400 >> 10;
    EVar17 = DEFAULT;
    if ((uVar10 << 0x36 | uVar3) < 4) {
      EVar17 = SHORT - (int)uVar3;
    }
    if (uVar5 == 6) {
      pSVar6 = (SimpleDateFormat *)icu_70::DateFormat::createDateTimeInstance(EVar17,EVar13,locale);
    }
    else if (uVar5 == 5) {
      pSVar6 = (SimpleDateFormat *)icu_70::DateFormat::createTimeInstance(EVar13,locale);
    }
    else if (uVar5 == 4) {
      pSVar6 = (SimpleDateFormat *)icu_70::DateFormat::createDateInstance(EVar17,locale);
    }
    else {
      pcVar1 = (local_268->_M_dataplus)._M_p;
      local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b0,pcVar1,pcVar1 + local_268->_M_string_length);
      icu_std_converter<char,_1>::icu_std_converter(&local_b0,local_1b0,cvt_skip);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
        operator_delete(local_1b0[0]._M_dataplus._M_p);
      }
      this_02 = ios_info::date_time_pattern_set(this_00);
      ios_info::string_set::get<char>(&local_220,this_02);
      icu_std_converter<char,_1>::icu(&local_70,(char_type *)&local_b0,local_220._M_dataplus._M_p);
      ftime = &local_70;
      strftime_to_icu((impl_icu *)local_260,(UnicodeString *)ftime,locale);
      icu_70::UnicodeString::~UnicodeString((UnicodeString *)&local_70);
      pSVar6 = (SimpleDateFormat *)icu_70::UMemory::operator_new((UMemory *)0x360,(ulong)ftime);
      if (pSVar6 != (SimpleDateFormat *)0x0) {
        icu_70::SimpleDateFormat::SimpleDateFormat
                  (pSVar6,(UnicodeString *)local_260,locale,&local_274);
      }
      icu_70::UnicodeString::~UnicodeString((UnicodeString *)local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.charset_._M_dataplus._M_p != &local_b0.charset_.field_2) {
        operator_delete(local_b0.charset_._M_dataplus._M_p);
      }
    }
    if (U_ZERO_ERROR < local_274) {
      if (pSVar6 == (SimpleDateFormat *)0x0) {
        return (__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
                )(__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
                  )this;
      }
      (**(code **)(*(long *)pSVar6 + 8))(pSVar6);
      return (__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
              )(__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
                )this;
    }
    ios_info::time_zone_abi_cxx11_((string *)local_260,this_00);
    psVar4 = local_268;
    pTVar11 = get_time_zone((string *)local_260);
    (**(code **)(*(long *)pSVar6 + 0xb8))(pSVar6,pTVar11);
    if ((_Impl *)local_260._0_8_ != (_Impl *)(local_260 + 0x10)) {
      operator_delete((void *)local_260._0_8_);
    }
    if (pSVar6 != (SimpleDateFormat *)0x0) {
      pdVar12 = (date_format<char> *)operator_new(0x48);
      pcVar1 = (psVar4->_M_dataplus)._M_p;
      local_270._M_head_impl = (DateFormat *)pSVar6;
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,pcVar1,pcVar1 + psVar4->_M_string_length);
      date_format<char>::date_format
                (pdVar12,(unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *
                         )&local_270,&local_1d0);
      plVar2 = *(long **)this;
      *(date_format<char> **)this = pdVar12;
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      if (local_270._M_head_impl == (DateFormat *)0x0) {
        return (__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
                )(__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
                  )this;
      }
      (**(code **)(*(long *)local_270._M_head_impl + 8))();
      return (__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
              )(__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
                )this;
    }
    pdVar12 = (date_format<char> *)operator_new(0x48);
    pcVar1 = (psVar4->_M_dataplus)._M_p;
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,pcVar1,pcVar1 + psVar4->_M_string_length);
    date_format<char>::date_format(pdVar12,(DateFormat *)0x0,&local_1f0);
    plVar2 = *(long **)this;
    *(date_format<char> **)this = pdVar12;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    _Var16._M_p = local_1f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p == &local_1f0.field_2) {
      return (__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
              )(__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
                )this;
    }
    goto LAB_00182b33;
  case 8:
    pnVar8 = (number_format<char> *)operator_new(0x40);
    pNVar9 = icu_formatters_cache::number_format(this_01,fmt_spell);
    paVar18 = &local_130.field_2;
    pcVar1 = (encoding->_M_dataplus)._M_p;
    local_130._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar1,pcVar1 + encoding->_M_string_length);
    number_format<char>::number_format(pnVar8,pNVar9,&local_130);
    *(number_format<char> **)this = pnVar8;
    _Var16._M_p = local_130._M_dataplus._M_p;
    break;
  case 9:
    pnVar8 = (number_format<char> *)operator_new(0x40);
    pNVar9 = icu_formatters_cache::number_format(this_01,fmt_ord);
    paVar18 = &local_150.field_2;
    pcVar1 = (encoding->_M_dataplus)._M_p;
    local_150._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar1,pcVar1 + encoding->_M_string_length);
    number_format<char>::number_format(pnVar8,pNVar9,&local_150);
    *(number_format<char> **)this = pnVar8;
    _Var16._M_p = local_150._M_dataplus._M_p;
    break;
  default:
    goto switchD_0018281f_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var16._M_p != paVar18) {
LAB_00182b33:
    operator_delete(_Var16._M_p);
  }
switchD_0018281f_default:
  return (__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
          )(__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<formatter<CharType> > generate_formatter(
                    std::ios_base &ios,
                    icu::Locale const &locale,
                    std::string const &encoding)
        {
            using namespace booster::locale::flags;

            std::unique_ptr<formatter<CharType> > fmt;
            ios_info &info=ios_info::get(ios);
            uint64_t disp = info.display_flags();

            icu_formatters_cache const &cache = std::use_facet<icu_formatters_cache>(ios.getloc());


            if(disp == posix)
                return fmt;
           
            UErrorCode err=U_ZERO_ERROR;
            
            switch(disp) {
            case number:
                {
                    std::ios_base::fmtflags how = (ios.flags() & std::ios_base::floatfield);
                    icu::NumberFormat *nf = 0;

                    if(how == std::ios_base::scientific)
                        nf = cache.number_format(icu_formatters_cache::fmt_sci);
                    else
                        nf = cache.number_format(icu_formatters_cache::fmt_number);
                    
                    nf->setMaximumFractionDigits(ios.precision());
                    if(how == std::ios_base::scientific || how == std::ios_base::fixed ) {
                        nf->setMinimumFractionDigits(ios.precision());
                    }
                    else {
                        nf->setMinimumFractionDigits(0);
                    }
                    fmt.reset(new number_format<CharType>(nf,encoding));
                }
                break;
            case currency:
                {
                    icu::NumberFormat *nf;
                    
                    uint64_t curr = info.currency_flags();

                    if(curr == currency_default || curr == currency_national)
                        nf = cache.number_format(icu_formatters_cache::fmt_curr_nat);
                    else
                        nf = cache.number_format(icu_formatters_cache::fmt_curr_iso);

                    fmt.reset(new number_format<CharType>(nf,encoding));
                }
                break;
            case percent:
                {
                    icu::NumberFormat *nf = cache.number_format(icu_formatters_cache::fmt_per);
                    nf->setMaximumFractionDigits(ios.precision());
                    std::ios_base::fmtflags how = (ios.flags() & std::ios_base::floatfield);
                    if(how == std::ios_base::scientific || how == std::ios_base::fixed ) {
                        nf->setMinimumFractionDigits(ios.precision());
                    }
                    else {
                        nf->setMinimumFractionDigits(0);
                    }
                    fmt.reset(new number_format<CharType>(nf,encoding));
                    
                }
                break;
            case spellout:
                fmt.reset(new number_format<CharType>(cache.number_format(icu_formatters_cache::fmt_spell),encoding));
                break;
            case ordinal:
                fmt.reset(new number_format<CharType>(cache.number_format(icu_formatters_cache::fmt_ord),encoding));
                break;
            case date:
            case time:
            case datetime:
            case strftime:
                {
                    using namespace flags;
                    std::unique_ptr<icu::DateFormat> adf;
                    icu::DateFormat *df = 0;
                    icu::SimpleDateFormat *sdf = cache.date_formatter();
                    // try to use cached first
                    if(sdf) {
                        int tmf=info.time_flags();
                        switch(tmf) {
                        case time_short:
                            tmf=0;
                            break;
                        case time_long:
                            tmf=2;
                            break;
                        case time_full:
                            tmf=3;
                            break;
                        case time_default:
                        case time_medium:
                        default:
                            tmf=1;
                        }
                        int dtf=info.date_flags();
                        switch(dtf) {
                        case date_short:
                            dtf=0;
                            break;
                        case date_long:
                            dtf=2;
                            break;
                        case date_full:
                            dtf=3;
                            break;
                        case date_default:
                        case date_medium:
                        default:
                            dtf=1;
                        }

                        icu::UnicodeString pattern;
                        switch(disp) {
                        case date:
                            pattern = cache.date_format_[dtf];
                            break;
                        case time:
                            pattern = cache.time_format_[tmf];
                            break;
                        case datetime:
                            pattern = cache.date_time_format_[dtf][tmf];
                            break;
                        case strftime:
                            {
                                if( !cache.date_format_[1].isEmpty() 
                                    && !cache.time_format_[1].isEmpty()
                                    && !cache.date_time_format_[1][1].isEmpty())
                                {
                                    icu_std_converter<CharType> cvt_(encoding);
                                    std::basic_string<CharType> const &f=info.date_time_pattern<CharType>();
                                    pattern = strftime_to_icu(cvt_.icu(f.c_str(),f.c_str()+f.size()),locale);
                                }
                            }
                            break;
                        }
                        if(!pattern.isEmpty()) {
                            sdf->applyPattern(pattern);
                            df = sdf;
                            sdf = 0;
                        }
                        sdf = 0;
                    }
                    
                    if(!df) {
                        icu::DateFormat::EStyle dstyle = icu::DateFormat::kDefault;
                        icu::DateFormat::EStyle tstyle = icu::DateFormat::kDefault;
                        
                        switch(info.time_flags()) {
                        case time_short:    tstyle=icu::DateFormat::kShort; break;
                        case time_medium:   tstyle=icu::DateFormat::kMedium; break;
                        case time_long:     tstyle=icu::DateFormat::kLong; break;
                        case time_full:     tstyle=icu::DateFormat::kFull; break;
                        }
                        switch(info.date_flags()) {
                        case date_short:    dstyle=icu::DateFormat::kShort; break;
                        case date_medium:   dstyle=icu::DateFormat::kMedium; break;
                        case date_long:     dstyle=icu::DateFormat::kLong; break;
                        case date_full:     dstyle=icu::DateFormat::kFull; break;
                        }
                        
                        if(disp==date)
                            adf.reset(icu::DateFormat::createDateInstance(dstyle,locale));
                        else if(disp==time)
                            adf.reset(icu::DateFormat::createTimeInstance(tstyle,locale));
                        else if(disp==datetime)
                            adf.reset(icu::DateFormat::createDateTimeInstance(dstyle,tstyle,locale));
                        else {// strftime
                            icu_std_converter<CharType> cvt_(encoding);
                            std::basic_string<CharType> const &f=info.date_time_pattern<CharType>();
                            icu::UnicodeString fmt = strftime_to_icu(cvt_.icu(f.data(),f.data()+f.size()),locale);
                            adf.reset(new icu::SimpleDateFormat(fmt,locale,err));
                        }
                        if(U_FAILURE(err)) 
                            return fmt;
                        df = adf.get();
                    }

                    df->adoptTimeZone(get_time_zone(info.time_zone()));
                        
                    // Depending if we own formatter or not
                    if(adf.get())
                        fmt.reset(new date_format<CharType>(std::move(adf),encoding));
                    else
                        fmt.reset(new date_format<CharType>(std::move(df),encoding));
                }
                break;
            }

            return fmt;
        }